

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  byte bVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  int iVar23;
  undefined4 uVar24;
  float *vertices;
  undefined1 (*pauVar25) [16];
  RayHitK<8> *pRVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  undefined1 (*pauVar32) [16];
  long lVar33;
  ulong uVar34;
  undefined1 (*pauVar35) [16];
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  Scene *pSVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  AABBNodeMB4D *node1;
  ulong uVar44;
  ulong uVar45;
  Geometry *pGVar46;
  ulong uVar47;
  ulong uVar48;
  undefined1 (*pauVar49) [16];
  ulong uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [64];
  undefined1 auVar111 [32];
  undefined1 auVar112 [64];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [64];
  undefined1 auVar120 [16];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [16];
  undefined1 auVar124 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [64];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [64];
  float fVar131;
  float fVar136;
  undefined1 auVar132 [16];
  float fVar134;
  float fVar135;
  undefined1 auVar133 [64];
  Scene *scene;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  RayHitK<8> local_2881;
  size_t local_2880;
  RayHitK<8> *local_2878;
  undefined1 local_2870 [16];
  undefined1 local_2860 [16];
  undefined1 local_2850 [16];
  Scene *local_2838;
  undefined1 local_2830 [16];
  undefined1 local_2820 [16];
  undefined1 local_2810 [16];
  undefined1 local_2800 [16];
  undefined1 local_27f0 [16];
  undefined1 local_27e0 [16];
  undefined1 local_27d0 [16];
  undefined1 local_27c0 [16];
  undefined1 local_27b0 [16];
  undefined1 local_27a0 [16];
  undefined1 local_2790 [16];
  long local_2780;
  long local_2778;
  ulong local_2770;
  ulong local_2768;
  undefined1 *local_2760;
  void *local_2758;
  RTCRayQueryContext *local_2750;
  RayHitK<8> *local_2748;
  undefined1 (*local_2740) [32];
  undefined4 local_2738;
  undefined8 local_2730;
  undefined8 uStack_2728;
  undefined1 local_2720 [32];
  float local_26f0;
  float fStack_26ec;
  float fStack_26e8;
  float fStack_26e4;
  undefined1 local_26e0 [16];
  undefined1 local_26d0 [16];
  RayHitK<8> *local_26c0;
  undefined1 local_26b0 [16];
  undefined1 local_26a0 [16];
  undefined1 local_2690 [16];
  undefined1 local_2680 [16];
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  undefined1 local_2640 [32];
  undefined1 local_2620 [16];
  undefined8 local_2610;
  undefined8 uStack_2608;
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined4 local_2440;
  undefined4 uStack_243c;
  undefined4 uStack_2438;
  undefined4 uStack_2434;
  undefined4 uStack_2430;
  undefined4 uStack_242c;
  undefined4 uStack_2428;
  undefined4 uStack_2424;
  undefined4 local_2420;
  undefined4 uStack_241c;
  undefined4 uStack_2418;
  undefined4 uStack_2414;
  undefined4 uStack_2410;
  undefined4 uStack_240c;
  undefined4 uStack_2408;
  undefined4 uStack_2404;
  undefined1 local_2400 [32];
  uint local_23e0;
  uint uStack_23dc;
  uint uStack_23d8;
  uint uStack_23d4;
  uint uStack_23d0;
  uint uStack_23cc;
  uint uStack_23c8;
  uint uStack_23c4;
  uint local_23c0;
  uint uStack_23bc;
  uint uStack_23b8;
  uint uStack_23b4;
  uint uStack_23b0;
  uint uStack_23ac;
  uint uStack_23a8;
  uint uStack_23a4;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar77 [32];
  
  pauVar25 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar24 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_24e0._4_4_ = uVar24;
  local_24e0._0_4_ = uVar24;
  local_24e0._8_4_ = uVar24;
  local_24e0._12_4_ = uVar24;
  local_24e0._16_4_ = uVar24;
  local_24e0._20_4_ = uVar24;
  local_24e0._24_4_ = uVar24;
  local_24e0._28_4_ = uVar24;
  auVar103 = ZEXT3264(local_24e0);
  uVar24 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2500._4_4_ = uVar24;
  local_2500._0_4_ = uVar24;
  local_2500._8_4_ = uVar24;
  local_2500._12_4_ = uVar24;
  local_2500._16_4_ = uVar24;
  local_2500._20_4_ = uVar24;
  local_2500._24_4_ = uVar24;
  local_2500._28_4_ = uVar24;
  auVar110 = ZEXT3264(local_2500);
  uVar24 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_2520._4_4_ = uVar24;
  local_2520._0_4_ = uVar24;
  local_2520._8_4_ = uVar24;
  local_2520._12_4_ = uVar24;
  local_2520._16_4_ = uVar24;
  local_2520._20_4_ = uVar24;
  local_2520._24_4_ = uVar24;
  local_2520._28_4_ = uVar24;
  auVar112 = ZEXT3264(local_2520);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar17 = fVar2 * 0.99999964;
  local_2540._4_4_ = fVar17;
  local_2540._0_4_ = fVar17;
  local_2540._8_4_ = fVar17;
  local_2540._12_4_ = fVar17;
  local_2540._16_4_ = fVar17;
  local_2540._20_4_ = fVar17;
  local_2540._24_4_ = fVar17;
  local_2540._28_4_ = fVar17;
  auVar119 = ZEXT3264(local_2540);
  fVar17 = fVar3 * 0.99999964;
  local_2560._4_4_ = fVar17;
  local_2560._0_4_ = fVar17;
  local_2560._8_4_ = fVar17;
  local_2560._12_4_ = fVar17;
  local_2560._16_4_ = fVar17;
  local_2560._20_4_ = fVar17;
  local_2560._24_4_ = fVar17;
  local_2560._28_4_ = fVar17;
  auVar121 = ZEXT3264(local_2560);
  fVar17 = fVar4 * 0.99999964;
  local_2580._4_4_ = fVar17;
  local_2580._0_4_ = fVar17;
  local_2580._8_4_ = fVar17;
  local_2580._12_4_ = fVar17;
  local_2580._16_4_ = fVar17;
  local_2580._20_4_ = fVar17;
  local_2580._24_4_ = fVar17;
  local_2580._28_4_ = fVar17;
  auVar122 = ZEXT3264(local_2580);
  fVar2 = fVar2 * 1.0000004;
  local_25a0._4_4_ = fVar2;
  local_25a0._0_4_ = fVar2;
  local_25a0._8_4_ = fVar2;
  local_25a0._12_4_ = fVar2;
  local_25a0._16_4_ = fVar2;
  local_25a0._20_4_ = fVar2;
  local_25a0._24_4_ = fVar2;
  local_25a0._28_4_ = fVar2;
  auVar124 = ZEXT3264(local_25a0);
  fVar3 = fVar3 * 1.0000004;
  local_25c0._4_4_ = fVar3;
  local_25c0._0_4_ = fVar3;
  local_25c0._8_4_ = fVar3;
  local_25c0._12_4_ = fVar3;
  local_25c0._16_4_ = fVar3;
  local_25c0._20_4_ = fVar3;
  local_25c0._24_4_ = fVar3;
  local_25c0._28_4_ = fVar3;
  auVar127 = ZEXT3264(local_25c0);
  fVar4 = fVar4 * 1.0000004;
  local_25e0._4_4_ = fVar4;
  local_25e0._0_4_ = fVar4;
  local_25e0._8_4_ = fVar4;
  local_25e0._12_4_ = fVar4;
  local_25e0._16_4_ = fVar4;
  local_25e0._20_4_ = fVar4;
  local_25e0._24_4_ = fVar4;
  local_25e0._28_4_ = fVar4;
  auVar130 = ZEXT3264(local_25e0);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_2768 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2770 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar50 = local_2768 ^ 0x20;
  iVar23 = (tray->tnear).field_0.i[k];
  local_2720._4_4_ = iVar23;
  local_2720._0_4_ = iVar23;
  local_2720._8_4_ = iVar23;
  local_2720._12_4_ = iVar23;
  local_2720._16_4_ = iVar23;
  local_2720._20_4_ = iVar23;
  local_2720._24_4_ = iVar23;
  local_2720._28_4_ = iVar23;
  auVar133 = ZEXT3264(local_2720);
  uVar48 = local_2770 ^ 0x20;
  iVar23 = (tray->tfar).field_0.i[k];
  auVar59 = ZEXT3264(CONCAT428(iVar23,CONCAT424(iVar23,CONCAT420(iVar23,CONCAT416(iVar23,CONCAT412(
                                                  iVar23,CONCAT48(iVar23,CONCAT44(iVar23,iVar23)))))
                                               )));
  iVar23 = 1 << ((uint)k & 0x1f);
  auVar69._4_4_ = iVar23;
  auVar69._0_4_ = iVar23;
  auVar69._8_4_ = iVar23;
  auVar69._12_4_ = iVar23;
  auVar69._16_4_ = iVar23;
  auVar69._20_4_ = iVar23;
  auVar69._24_4_ = iVar23;
  auVar69._28_4_ = iVar23;
  auVar58 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar69 = vpand_avx2(auVar69,auVar58);
  local_2600 = vpcmpeqd_avx2(auVar69,auVar58);
  local_2878 = ray;
  local_2880 = k;
LAB_0062d5d2:
  do {
    pauVar49 = pauVar25 + -1;
    pauVar25 = pauVar25 + -1;
    if (*(float *)(*pauVar49 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      uVar34 = *(ulong *)*pauVar25;
      while ((uVar34 & 8) == 0) {
        uVar24 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar70._4_4_ = uVar24;
        auVar70._0_4_ = uVar24;
        auVar70._8_4_ = uVar24;
        auVar70._12_4_ = uVar24;
        auVar70._16_4_ = uVar24;
        auVar70._20_4_ = uVar24;
        auVar70._24_4_ = uVar24;
        auVar70._28_4_ = uVar24;
        uVar44 = uVar34 & 0xfffffffffffffff0;
        auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar44 + 0x100 + uVar41),auVar70,
                                  *(undefined1 (*) [32])(uVar44 + 0x40 + uVar41));
        auVar77 = auVar103._0_32_;
        auVar69 = vsubps_avx(ZEXT1632(auVar60),auVar77);
        auVar58._4_4_ = auVar119._4_4_ * auVar69._4_4_;
        auVar58._0_4_ = auVar119._0_4_ * auVar69._0_4_;
        auVar58._8_4_ = auVar119._8_4_ * auVar69._8_4_;
        auVar58._12_4_ = auVar119._12_4_ * auVar69._12_4_;
        auVar58._16_4_ = auVar119._16_4_ * auVar69._16_4_;
        auVar58._20_4_ = auVar119._20_4_ * auVar69._20_4_;
        auVar58._24_4_ = auVar119._24_4_ * auVar69._24_4_;
        auVar58._28_4_ = auVar69._28_4_;
        auVar69 = vmaxps_avx(auVar133._0_32_,auVar58);
        auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar44 + 0x100 + local_2768),auVar70,
                                  *(undefined1 (*) [32])(uVar44 + 0x40 + local_2768));
        auVar71 = auVar110._0_32_;
        auVar58 = vsubps_avx(ZEXT1632(auVar60),auVar71);
        auVar78._4_4_ = auVar121._4_4_ * auVar58._4_4_;
        auVar78._0_4_ = auVar121._0_4_ * auVar58._0_4_;
        auVar78._8_4_ = auVar121._8_4_ * auVar58._8_4_;
        auVar78._12_4_ = auVar121._12_4_ * auVar58._12_4_;
        auVar78._16_4_ = auVar121._16_4_ * auVar58._16_4_;
        auVar78._20_4_ = auVar121._20_4_ * auVar58._20_4_;
        auVar78._24_4_ = auVar121._24_4_ * auVar58._24_4_;
        auVar78._28_4_ = auVar58._28_4_;
        auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar44 + 0x100 + local_2770),auVar70,
                                  *(undefined1 (*) [32])(uVar44 + 0x40 + local_2770));
        auVar111 = auVar112._0_32_;
        auVar58 = vsubps_avx(ZEXT1632(auVar60),auVar111);
        auVar19._4_4_ = auVar122._4_4_ * auVar58._4_4_;
        auVar19._0_4_ = auVar122._0_4_ * auVar58._0_4_;
        auVar19._8_4_ = auVar122._8_4_ * auVar58._8_4_;
        auVar19._12_4_ = auVar122._12_4_ * auVar58._12_4_;
        auVar19._16_4_ = auVar122._16_4_ * auVar58._16_4_;
        auVar19._20_4_ = auVar122._20_4_ * auVar58._20_4_;
        auVar19._24_4_ = auVar122._24_4_ * auVar58._24_4_;
        auVar19._28_4_ = auVar58._28_4_;
        auVar58 = vmaxps_avx(auVar78,auVar19);
        local_24c0 = vmaxps_avx(auVar69,auVar58);
        auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar44 + 0x100 + (uVar41 ^ 0x20)),auVar70,
                                  *(undefined1 (*) [32])(uVar44 + 0x40 + (uVar41 ^ 0x20)));
        auVar69 = vsubps_avx(ZEXT1632(auVar60),auVar77);
        auVar20._4_4_ = auVar124._4_4_ * auVar69._4_4_;
        auVar20._0_4_ = auVar124._0_4_ * auVar69._0_4_;
        auVar20._8_4_ = auVar124._8_4_ * auVar69._8_4_;
        auVar20._12_4_ = auVar124._12_4_ * auVar69._12_4_;
        auVar20._16_4_ = auVar124._16_4_ * auVar69._16_4_;
        auVar20._20_4_ = auVar124._20_4_ * auVar69._20_4_;
        auVar20._24_4_ = auVar124._24_4_ * auVar69._24_4_;
        auVar20._28_4_ = auVar69._28_4_;
        auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar44 + 0x100 + uVar50),auVar70,
                                  *(undefined1 (*) [32])(uVar44 + 0x40 + uVar50));
        auVar69 = vsubps_avx(ZEXT1632(auVar60),auVar71);
        auVar21._4_4_ = auVar127._4_4_ * auVar69._4_4_;
        auVar21._0_4_ = auVar127._0_4_ * auVar69._0_4_;
        auVar21._8_4_ = auVar127._8_4_ * auVar69._8_4_;
        auVar21._12_4_ = auVar127._12_4_ * auVar69._12_4_;
        auVar21._16_4_ = auVar127._16_4_ * auVar69._16_4_;
        auVar21._20_4_ = auVar127._20_4_ * auVar69._20_4_;
        auVar21._24_4_ = auVar127._24_4_ * auVar69._24_4_;
        auVar21._28_4_ = auVar69._28_4_;
        auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar44 + 0x100 + uVar48),auVar70,
                                  *(undefined1 (*) [32])(uVar44 + 0x40 + uVar48));
        auVar69 = vsubps_avx(ZEXT1632(auVar60),auVar111);
        auVar22._4_4_ = auVar130._4_4_ * auVar69._4_4_;
        auVar22._0_4_ = auVar130._0_4_ * auVar69._0_4_;
        auVar22._8_4_ = auVar130._8_4_ * auVar69._8_4_;
        auVar22._12_4_ = auVar130._12_4_ * auVar69._12_4_;
        auVar22._16_4_ = auVar130._16_4_ * auVar69._16_4_;
        auVar22._20_4_ = auVar130._20_4_ * auVar69._20_4_;
        auVar22._24_4_ = auVar130._24_4_ * auVar69._24_4_;
        auVar22._28_4_ = auVar69._28_4_;
        auVar69 = vminps_avx(auVar21,auVar22);
        auVar58 = vminps_avx(auVar59._0_32_,auVar20);
        auVar69 = vminps_avx(auVar58,auVar69);
        auVar69 = vcmpps_avx(local_24c0,auVar69,2);
        if (((uint)uVar34 & 7) == 6) {
          auVar58 = vcmpps_avx(*(undefined1 (*) [32])(uVar44 + 0x1c0),auVar70,2);
          auVar78 = vcmpps_avx(auVar70,*(undefined1 (*) [32])(uVar44 + 0x1e0),1);
          auVar58 = vandps_avx(auVar58,auVar78);
          auVar69 = vandps_avx(auVar58,auVar69);
          auVar60 = vpackssdw_avx(auVar69._0_16_,auVar69._16_16_);
        }
        else {
          auVar60 = vpackssdw_avx(auVar69._0_16_,auVar69._16_16_);
        }
        auVar60 = vpsllw_avx(auVar60,0xf);
        if ((((((((auVar60 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar60 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar60 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar60 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar60 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar60 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar60 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar60[0xf]
           ) {
          if (pauVar25 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_0062d5d2;
        }
        auVar60 = vpacksswb_avx(auVar60,auVar60);
        bVar18 = SUB161(auVar60 >> 7,0) & 1 | (SUB161(auVar60 >> 0xf,0) & 1) << 1 |
                 (SUB161(auVar60 >> 0x17,0) & 1) << 2 | (SUB161(auVar60 >> 0x1f,0) & 1) << 3 |
                 (SUB161(auVar60 >> 0x27,0) & 1) << 4 | (SUB161(auVar60 >> 0x2f,0) & 1) << 5 |
                 (SUB161(auVar60 >> 0x37,0) & 1) << 6 | SUB161(auVar60 >> 0x3f,0) << 7;
        lVar27 = 0;
        for (uVar34 = (ulong)bVar18; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
          lVar27 = lVar27 + 1;
        }
        uVar34 = *(ulong *)(uVar44 + lVar27 * 8);
        uVar30 = bVar18 - 1 & (uint)bVar18;
        uVar31 = (ulong)uVar30;
        if (uVar30 != 0) {
          uVar6 = *(uint *)(local_24c0 + lVar27 * 4);
          lVar27 = 0;
          for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
            lVar27 = lVar27 + 1;
          }
          uVar30 = uVar30 - 1 & uVar30;
          uVar29 = (ulong)uVar30;
          uVar31 = *(ulong *)(uVar44 + lVar27 * 8);
          uVar7 = *(uint *)(local_24c0 + lVar27 * 4);
          if (uVar30 == 0) {
            if (uVar6 < uVar7) {
              *(ulong *)*pauVar25 = uVar31;
              *(uint *)(*pauVar25 + 8) = uVar7;
              pauVar25 = pauVar25 + 1;
            }
            else {
              *(ulong *)*pauVar25 = uVar34;
              *(uint *)(*pauVar25 + 8) = uVar6;
              pauVar25 = pauVar25 + 1;
              uVar34 = uVar31;
            }
          }
          else {
            auVar60._8_8_ = 0;
            auVar60._0_8_ = uVar34;
            auVar60 = vpunpcklqdq_avx(auVar60,ZEXT416(uVar6));
            auVar72._8_8_ = 0;
            auVar72._0_8_ = uVar31;
            auVar72 = vpunpcklqdq_avx(auVar72,ZEXT416(uVar7));
            lVar27 = 0;
            for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
              lVar27 = lVar27 + 1;
            }
            uVar30 = uVar30 - 1 & uVar30;
            uVar34 = (ulong)uVar30;
            auVar79._8_8_ = 0;
            auVar79._0_8_ = *(ulong *)(uVar44 + lVar27 * 8);
            auVar61 = vpunpcklqdq_avx(auVar79,ZEXT416(*(uint *)(local_24c0 + lVar27 * 4)));
            auVar79 = vpcmpgtd_avx(auVar72,auVar60);
            if (uVar30 == 0) {
              auVar90 = vpshufd_avx(auVar79,0xaa);
              auVar79 = vblendvps_avx(auVar72,auVar60,auVar90);
              auVar60 = vblendvps_avx(auVar60,auVar72,auVar90);
              auVar72 = vpcmpgtd_avx(auVar61,auVar79);
              auVar90 = vpshufd_avx(auVar72,0xaa);
              auVar72 = vblendvps_avx(auVar61,auVar79,auVar90);
              auVar79 = vblendvps_avx(auVar79,auVar61,auVar90);
              auVar61 = vpcmpgtd_avx(auVar79,auVar60);
              auVar90 = vpshufd_avx(auVar61,0xaa);
              auVar61 = vblendvps_avx(auVar79,auVar60,auVar90);
              auVar60 = vblendvps_avx(auVar60,auVar79,auVar90);
              *pauVar25 = auVar60;
              pauVar25[1] = auVar61;
              uVar34 = auVar72._0_8_;
              pauVar25 = pauVar25 + 2;
            }
            else {
              lVar27 = 0;
              for (; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
                lVar27 = lVar27 + 1;
              }
              uVar30 = uVar30 - 1 & uVar30;
              uVar31 = (ulong)uVar30;
              auVar90._8_8_ = 0;
              auVar90._0_8_ = *(ulong *)(uVar44 + lVar27 * 8);
              auVar90 = vpunpcklqdq_avx(auVar90,ZEXT416(*(uint *)(local_24c0 + lVar27 * 4)));
              if (uVar30 == 0) {
                auVar64 = vpshufd_avx(auVar79,0xaa);
                auVar79 = vblendvps_avx(auVar72,auVar60,auVar64);
                auVar60 = vblendvps_avx(auVar60,auVar72,auVar64);
                auVar72 = vpcmpgtd_avx(auVar90,auVar61);
                auVar64 = vpshufd_avx(auVar72,0xaa);
                auVar72 = vblendvps_avx(auVar90,auVar61,auVar64);
                auVar61 = vblendvps_avx(auVar61,auVar90,auVar64);
                auVar90 = vpcmpgtd_avx(auVar61,auVar60);
                auVar64 = vpshufd_avx(auVar90,0xaa);
                auVar90 = vblendvps_avx(auVar61,auVar60,auVar64);
                auVar60 = vblendvps_avx(auVar60,auVar61,auVar64);
                auVar61 = vpcmpgtd_avx(auVar72,auVar79);
                auVar64 = vpshufd_avx(auVar61,0xaa);
                auVar61 = vblendvps_avx(auVar72,auVar79,auVar64);
                auVar72 = vblendvps_avx(auVar79,auVar72,auVar64);
                auVar79 = vpcmpgtd_avx(auVar90,auVar72);
                auVar64 = vpshufd_avx(auVar79,0xaa);
                auVar79 = vblendvps_avx(auVar90,auVar72,auVar64);
                auVar72 = vblendvps_avx(auVar72,auVar90,auVar64);
                *pauVar25 = auVar60;
                pauVar25[1] = auVar72;
                pauVar25[2] = auVar79;
                uVar34 = auVar61._0_8_;
                pauVar49 = pauVar25 + 3;
              }
              else {
                *pauVar25 = auVar60;
                pauVar25[1] = auVar72;
                pauVar25[2] = auVar61;
                pauVar25[3] = auVar90;
                lVar27 = 0x30;
                do {
                  lVar28 = lVar27;
                  lVar27 = 0;
                  for (uVar34 = uVar31; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000
                      ) {
                    lVar27 = lVar27 + 1;
                  }
                  uVar34 = *(ulong *)(uVar44 + lVar27 * 8);
                  auVar61._8_8_ = 0;
                  auVar61._0_8_ = uVar34;
                  auVar60 = vpunpcklqdq_avx(auVar61,ZEXT416(*(uint *)(local_24c0 + lVar27 * 4)));
                  *(undefined1 (*) [16])(pauVar25[1] + lVar28) = auVar60;
                  uVar31 = uVar31 - 1 & uVar31;
                  lVar27 = lVar28 + 0x10;
                } while (uVar31 != 0);
                pauVar49 = (undefined1 (*) [16])(pauVar25[1] + lVar28);
                if (lVar28 + 0x10 != 0) {
                  lVar27 = 0x10;
                  pauVar32 = pauVar25;
                  do {
                    auVar60 = pauVar32[1];
                    pauVar32 = pauVar32 + 1;
                    uVar30 = vextractps_avx(auVar60,2);
                    lVar28 = lVar27;
                    do {
                      if (uVar30 <= *(uint *)(pauVar25[-1] + lVar28 + 8)) {
                        pauVar35 = (undefined1 (*) [16])(*pauVar25 + lVar28);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar25 + lVar28) =
                           *(undefined1 (*) [16])(pauVar25[-1] + lVar28);
                      lVar28 = lVar28 + -0x10;
                      pauVar35 = pauVar25;
                    } while (lVar28 != 0);
                    *pauVar35 = auVar60;
                    lVar27 = lVar27 + 0x10;
                  } while (pauVar49 != pauVar32);
                  uVar34 = *(ulong *)*pauVar49;
                }
              }
              auVar103 = ZEXT3264(auVar77);
              auVar110 = ZEXT3264(auVar71);
              auVar112 = ZEXT3264(auVar111);
              auVar119 = ZEXT3264(auVar119._0_32_);
              auVar121 = ZEXT3264(auVar121._0_32_);
              auVar122 = ZEXT3264(auVar122._0_32_);
              auVar124 = ZEXT3264(auVar124._0_32_);
              auVar127 = ZEXT3264(auVar127._0_32_);
              auVar130 = ZEXT3264(auVar130._0_32_);
              auVar133 = ZEXT3264(local_2720);
              pauVar25 = pauVar49;
              k = local_2880;
              ray = local_2878;
            }
          }
        }
      }
      local_2780 = (ulong)((uint)uVar34 & 0xf) - 8;
      if (local_2780 != 0) {
        uVar34 = uVar34 & 0xfffffffffffffff0;
        local_2778 = 0;
        do {
          lVar33 = local_2778 * 0x50;
          pSVar40 = context->scene;
          pGVar46 = (pSVar40->geometries).items[*(uint *)(uVar34 + 0x30 + lVar33)].ptr;
          fVar2 = (pGVar46->time_range).lower;
          fVar2 = pGVar46->fnumTimeSegments *
                  ((*(float *)(ray + k * 4 + 0xe0) - fVar2) / ((pGVar46->time_range).upper - fVar2))
          ;
          auVar60 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
          auVar60 = vminss_avx(auVar60,ZEXT416((uint)(pGVar46->fnumTimeSegments + -1.0)));
          auVar73 = vmaxss_avx(ZEXT816(0),auVar60);
          lVar28 = (long)(int)auVar73._0_4_ * 0x38;
          uVar47 = (ulong)*(uint *)(uVar34 + 4 + lVar33);
          lVar27 = *(long *)(*(long *)&pGVar46[2].numPrimitives + lVar28);
          lVar28 = *(long *)(*(long *)&pGVar46[2].numPrimitives + 0x38 + lVar28);
          auVar60 = *(undefined1 (*) [16])(lVar27 + (ulong)*(uint *)(uVar34 + lVar33) * 4);
          uVar45 = (ulong)*(uint *)(uVar34 + 0x10 + lVar33);
          auVar72 = *(undefined1 (*) [16])(lVar27 + uVar45 * 4);
          uVar36 = (ulong)*(uint *)(uVar34 + 0x20 + lVar33);
          auVar82 = *(undefined1 (*) [16])(lVar27 + uVar36 * 4);
          auVar79 = *(undefined1 (*) [16])(lVar27 + uVar47 * 4);
          uVar37 = (ulong)*(uint *)(uVar34 + 0x14 + lVar33);
          auVar61 = *(undefined1 (*) [16])(lVar27 + uVar37 * 4);
          uVar38 = (ulong)*(uint *)(uVar34 + 0x24 + lVar33);
          auVar84 = *(undefined1 (*) [16])(lVar27 + uVar38 * 4);
          uVar39 = (ulong)*(uint *)(uVar34 + 8 + lVar33);
          auVar90 = *(undefined1 (*) [16])(lVar27 + uVar39 * 4);
          uVar44 = (ulong)*(uint *)(uVar34 + 0x18 + lVar33);
          auVar64 = *(undefined1 (*) [16])(lVar27 + uVar44 * 4);
          uVar42 = (ulong)*(uint *)(uVar34 + 0x28 + lVar33);
          auVar62 = *(undefined1 (*) [16])(lVar27 + uVar42 * 4);
          uVar43 = (ulong)*(uint *)(uVar34 + 0xc + lVar33);
          auVar54 = *(undefined1 (*) [16])(lVar27 + uVar43 * 4);
          uVar31 = (ulong)*(uint *)(uVar34 + 0x1c + lVar33);
          auVar52 = *(undefined1 (*) [16])(lVar27 + uVar31 * 4);
          uVar29 = (ulong)*(uint *)(uVar34 + 0x2c + lVar33);
          auVar51 = *(undefined1 (*) [16])(lVar27 + uVar29 * 4);
          auVar53 = *(undefined1 (*) [16])(lVar28 + (ulong)*(uint *)(uVar34 + lVar33) * 4);
          auVar63 = *(undefined1 (*) [16])(lVar28 + uVar45 * 4);
          fVar2 = fVar2 - auVar73._0_4_;
          auVar73 = vunpcklps_avx(auVar60,auVar90);
          auVar90 = vunpckhps_avx(auVar60,auVar90);
          auVar74 = vunpcklps_avx(auVar79,auVar54);
          auVar79 = vunpckhps_avx(auVar79,auVar54);
          auVar60 = *(undefined1 (*) [16])(lVar28 + uVar47 * 4);
          auVar80 = vunpcklps_avx(auVar90,auVar79);
          auVar81 = vunpcklps_avx(auVar73,auVar74);
          auVar90 = vunpckhps_avx(auVar73,auVar74);
          auVar54 = vunpcklps_avx(auVar72,auVar64);
          auVar79 = vunpckhps_avx(auVar72,auVar64);
          auVar64 = vunpcklps_avx(auVar61,auVar52);
          auVar61 = vunpckhps_avx(auVar61,auVar52);
          auVar72 = *(undefined1 (*) [16])(lVar28 + uVar39 * 4);
          auVar52 = vunpcklps_avx(auVar79,auVar61);
          auVar73 = vunpcklps_avx(auVar54,auVar64);
          auVar61 = vunpckhps_avx(auVar54,auVar64);
          auVar54 = vunpcklps_avx(auVar82,auVar62);
          auVar64 = vunpckhps_avx(auVar82,auVar62);
          auVar74 = vunpcklps_avx(auVar84,auVar51);
          auVar62 = vunpckhps_avx(auVar84,auVar51);
          auVar79 = *(undefined1 (*) [16])(lVar28 + uVar43 * 4);
          auVar51 = vunpcklps_avx(auVar64,auVar62);
          auVar82 = vunpcklps_avx(auVar54,auVar74);
          auVar64 = vunpckhps_avx(auVar54,auVar74);
          auVar62 = vunpcklps_avx(auVar53,auVar72);
          auVar72 = vunpckhps_avx(auVar53,auVar72);
          auVar54 = vunpcklps_avx(auVar60,auVar79);
          auVar79 = vunpckhps_avx(auVar60,auVar79);
          auVar60 = *(undefined1 (*) [16])(lVar28 + uVar44 * 4);
          auVar53 = vunpcklps_avx(auVar72,auVar79);
          auVar74 = vunpcklps_avx(auVar62,auVar54);
          auVar79 = vunpckhps_avx(auVar62,auVar54);
          auVar54 = vunpcklps_avx(auVar63,auVar60);
          auVar62 = vunpckhps_avx(auVar63,auVar60);
          auVar60 = *(undefined1 (*) [16])(lVar28 + uVar37 * 4);
          auVar72 = *(undefined1 (*) [16])(lVar28 + uVar31 * 4);
          auVar63 = vunpcklps_avx(auVar60,auVar72);
          auVar60 = vunpckhps_avx(auVar60,auVar72);
          auVar84 = vunpcklps_avx(auVar62,auVar60);
          auVar83 = vunpcklps_avx(auVar54,auVar63);
          auVar62 = vunpckhps_avx(auVar54,auVar63);
          auVar60 = *(undefined1 (*) [16])(lVar28 + uVar36 * 4);
          auVar72 = *(undefined1 (*) [16])(lVar28 + uVar42 * 4);
          auVar63 = vunpcklps_avx(auVar60,auVar72);
          auVar54 = vunpckhps_avx(auVar60,auVar72);
          auVar60 = *(undefined1 (*) [16])(lVar28 + uVar38 * 4);
          auVar72 = *(undefined1 (*) [16])(lVar28 + uVar29 * 4);
          auVar85 = vunpcklps_avx(auVar60,auVar72);
          auVar60 = vunpckhps_avx(auVar60,auVar72);
          auVar72 = vunpcklps_avx(auVar54,auVar60);
          auVar54 = vunpcklps_avx(auVar63,auVar85);
          auVar60 = vunpckhps_avx(auVar63,auVar85);
          fVar3 = 1.0 - fVar2;
          auVar123._4_4_ = fVar3;
          auVar123._0_4_ = fVar3;
          auVar123._8_4_ = fVar3;
          auVar123._12_4_ = fVar3;
          auVar95._0_4_ = fVar2 * auVar74._0_4_;
          auVar95._4_4_ = fVar2 * auVar74._4_4_;
          auVar95._8_4_ = fVar2 * auVar74._8_4_;
          auVar95._12_4_ = fVar2 * auVar74._12_4_;
          auVar63 = vfmadd231ps_fma(auVar95,auVar123,auVar81);
          auVar113._0_4_ = fVar2 * auVar79._0_4_;
          auVar113._4_4_ = fVar2 * auVar79._4_4_;
          auVar113._8_4_ = fVar2 * auVar79._8_4_;
          auVar113._12_4_ = fVar2 * auVar79._12_4_;
          auVar79 = vfmadd231ps_fma(auVar113,auVar123,auVar90);
          auVar104._0_4_ = fVar2 * auVar53._0_4_;
          auVar104._4_4_ = fVar2 * auVar53._4_4_;
          auVar104._8_4_ = fVar2 * auVar53._8_4_;
          auVar104._12_4_ = fVar2 * auVar53._12_4_;
          auVar90 = vfmadd231ps_fma(auVar104,auVar123,auVar80);
          auVar91._0_4_ = fVar2 * auVar83._0_4_;
          auVar91._4_4_ = fVar2 * auVar83._4_4_;
          auVar91._8_4_ = fVar2 * auVar83._8_4_;
          auVar91._12_4_ = fVar2 * auVar83._12_4_;
          auVar53 = vfmadd231ps_fma(auVar91,auVar123,auVar73);
          auVar83._0_4_ = fVar2 * auVar62._0_4_;
          auVar83._4_4_ = fVar2 * auVar62._4_4_;
          auVar83._8_4_ = fVar2 * auVar62._8_4_;
          auVar83._12_4_ = fVar2 * auVar62._12_4_;
          auVar61 = vfmadd231ps_fma(auVar83,auVar123,auVar61);
          puVar1 = (undefined8 *)(uVar34 + 0x30 + lVar33);
          local_2610 = *puVar1;
          uStack_2608 = puVar1[1];
          puVar1 = (undefined8 *)(uVar34 + 0x40 + lVar33);
          auVar62._0_4_ = fVar2 * auVar84._0_4_;
          auVar62._4_4_ = fVar2 * auVar84._4_4_;
          auVar62._8_4_ = fVar2 * auVar84._8_4_;
          auVar62._12_4_ = fVar2 * auVar84._12_4_;
          auVar62 = vfmadd231ps_fma(auVar62,auVar123,auVar52);
          auVar73._0_4_ = fVar2 * auVar54._0_4_;
          auVar73._4_4_ = fVar2 * auVar54._4_4_;
          auVar73._8_4_ = fVar2 * auVar54._8_4_;
          auVar73._12_4_ = fVar2 * auVar54._12_4_;
          auVar80._0_4_ = fVar2 * auVar60._0_4_;
          auVar80._4_4_ = fVar2 * auVar60._4_4_;
          auVar80._8_4_ = fVar2 * auVar60._8_4_;
          auVar80._12_4_ = fVar2 * auVar60._12_4_;
          auVar120._0_4_ = fVar2 * auVar72._0_4_;
          auVar120._4_4_ = fVar2 * auVar72._4_4_;
          auVar120._8_4_ = fVar2 * auVar72._8_4_;
          auVar120._12_4_ = fVar2 * auVar72._12_4_;
          auVar54 = vfmadd231ps_fma(auVar73,auVar123,auVar82);
          auVar64 = vfmadd231ps_fma(auVar80,auVar123,auVar64);
          auVar52 = vfmadd231ps_fma(auVar120,auVar123,auVar51);
          local_2730 = *puVar1;
          uStack_2728 = puVar1[1];
          uVar24 = *(undefined4 *)(local_2878 + local_2880 * 4);
          auVar51._4_4_ = uVar24;
          auVar51._0_4_ = uVar24;
          auVar51._8_4_ = uVar24;
          auVar51._12_4_ = uVar24;
          uVar24 = *(undefined4 *)(local_2878 + local_2880 * 4 + 0x20);
          auVar125._4_4_ = uVar24;
          auVar125._0_4_ = uVar24;
          auVar125._8_4_ = uVar24;
          auVar125._12_4_ = uVar24;
          uVar24 = *(undefined4 *)(local_2878 + local_2880 * 4 + 0x40);
          auVar128._4_4_ = uVar24;
          auVar128._0_4_ = uVar24;
          auVar128._8_4_ = uVar24;
          auVar128._12_4_ = uVar24;
          local_2810 = vsubps_avx(auVar63,auVar51);
          local_2790 = vsubps_avx(auVar79,auVar125);
          local_27a0 = vsubps_avx(auVar90,auVar128);
          auVar60 = vsubps_avx(auVar53,auVar51);
          auVar72 = vsubps_avx(auVar61,auVar125);
          auVar79 = vsubps_avx(auVar62,auVar128);
          auVar61 = vsubps_avx(auVar54,auVar51);
          auVar90 = vsubps_avx(auVar64,auVar125);
          auVar64 = vsubps_avx(auVar52,auVar128);
          local_2820 = vsubps_avx(auVar61,local_2810);
          local_27b0 = vsubps_avx(auVar90,local_2790);
          local_2830 = vsubps_avx(auVar64,local_27a0);
          auVar52._0_4_ = auVar61._0_4_ + local_2810._0_4_;
          auVar52._4_4_ = auVar61._4_4_ + local_2810._4_4_;
          auVar52._8_4_ = auVar61._8_4_ + local_2810._8_4_;
          auVar52._12_4_ = auVar61._12_4_ + local_2810._12_4_;
          auVar81._0_4_ = auVar90._0_4_ + local_2790._0_4_;
          auVar81._4_4_ = auVar90._4_4_ + local_2790._4_4_;
          auVar81._8_4_ = auVar90._8_4_ + local_2790._8_4_;
          auVar81._12_4_ = auVar90._12_4_ + local_2790._12_4_;
          fVar3 = local_27a0._0_4_;
          auVar84._0_4_ = auVar64._0_4_ + fVar3;
          fVar4 = local_27a0._4_4_;
          auVar84._4_4_ = auVar64._4_4_ + fVar4;
          fVar17 = local_27a0._8_4_;
          auVar84._8_4_ = auVar64._8_4_ + fVar17;
          fVar8 = local_27a0._12_4_;
          auVar84._12_4_ = auVar64._12_4_ + fVar8;
          auVar126._0_4_ = local_2830._0_4_ * auVar81._0_4_;
          auVar126._4_4_ = local_2830._4_4_ * auVar81._4_4_;
          auVar126._8_4_ = local_2830._8_4_ * auVar81._8_4_;
          auVar126._12_4_ = local_2830._12_4_ * auVar81._12_4_;
          auVar54 = vfmsub231ps_fma(auVar126,local_27b0,auVar84);
          auVar85._0_4_ = local_2820._0_4_ * auVar84._0_4_;
          auVar85._4_4_ = local_2820._4_4_ * auVar84._4_4_;
          auVar85._8_4_ = local_2820._8_4_ * auVar84._8_4_;
          auVar85._12_4_ = local_2820._12_4_ * auVar84._12_4_;
          auVar62 = vfmsub231ps_fma(auVar85,local_2830,auVar52);
          auVar53._0_4_ = local_27b0._0_4_ * auVar52._0_4_;
          auVar53._4_4_ = local_27b0._4_4_ * auVar52._4_4_;
          auVar53._8_4_ = local_27b0._8_4_ * auVar52._8_4_;
          auVar53._12_4_ = local_27b0._12_4_ * auVar52._12_4_;
          auVar52 = vfmsub231ps_fma(auVar53,local_2820,auVar81);
          fVar2 = *(float *)(local_2878 + local_2880 * 4 + 0xc0);
          auVar74._0_4_ = fVar2 * auVar52._0_4_;
          auVar74._4_4_ = fVar2 * auVar52._4_4_;
          auVar74._8_4_ = fVar2 * auVar52._8_4_;
          auVar74._12_4_ = fVar2 * auVar52._12_4_;
          uVar24 = *(undefined4 *)(local_2878 + local_2880 * 4 + 0xa0);
          auVar114._4_4_ = uVar24;
          auVar114._0_4_ = uVar24;
          auVar114._8_4_ = uVar24;
          auVar114._12_4_ = uVar24;
          auVar62 = vfmadd231ps_fma(auVar74,auVar114,auVar62);
          uVar24 = *(undefined4 *)(local_2878 + local_2880 * 4 + 0x80);
          auVar129._4_4_ = uVar24;
          auVar129._0_4_ = uVar24;
          auVar129._8_4_ = uVar24;
          auVar129._12_4_ = uVar24;
          local_27f0 = vfmadd231ps_fma(auVar62,auVar129,auVar54);
          local_27c0 = vsubps_avx(local_2790,auVar72);
          local_27e0 = vsubps_avx(local_27a0,auVar79);
          auVar82._0_4_ = local_2790._0_4_ + auVar72._0_4_;
          auVar82._4_4_ = local_2790._4_4_ + auVar72._4_4_;
          auVar82._8_4_ = local_2790._8_4_ + auVar72._8_4_;
          auVar82._12_4_ = local_2790._12_4_ + auVar72._12_4_;
          auVar86._0_4_ = auVar79._0_4_ + fVar3;
          auVar86._4_4_ = auVar79._4_4_ + fVar4;
          auVar86._8_4_ = auVar79._8_4_ + fVar17;
          auVar86._12_4_ = auVar79._12_4_ + fVar8;
          fVar9 = local_27e0._0_4_;
          auVar96._0_4_ = auVar82._0_4_ * fVar9;
          fVar11 = local_27e0._4_4_;
          auVar96._4_4_ = auVar82._4_4_ * fVar11;
          fVar13 = local_27e0._8_4_;
          auVar96._8_4_ = auVar82._8_4_ * fVar13;
          fVar15 = local_27e0._12_4_;
          auVar96._12_4_ = auVar82._12_4_ * fVar15;
          auVar54 = vfmsub231ps_fma(auVar96,local_27c0,auVar86);
          local_27d0 = vsubps_avx(local_2810,auVar60);
          fVar131 = local_27d0._0_4_;
          auVar105._0_4_ = fVar131 * auVar86._0_4_;
          fVar134 = local_27d0._4_4_;
          auVar105._4_4_ = fVar134 * auVar86._4_4_;
          fVar135 = local_27d0._8_4_;
          auVar105._8_4_ = fVar135 * auVar86._8_4_;
          fVar136 = local_27d0._12_4_;
          auVar105._12_4_ = fVar136 * auVar86._12_4_;
          auVar87._0_4_ = local_2810._0_4_ + auVar60._0_4_;
          auVar87._4_4_ = local_2810._4_4_ + auVar60._4_4_;
          auVar87._8_4_ = local_2810._8_4_ + auVar60._8_4_;
          auVar87._12_4_ = local_2810._12_4_ + auVar60._12_4_;
          auVar62 = vfmsub231ps_fma(auVar105,local_27e0,auVar87);
          fVar10 = local_27c0._0_4_;
          auVar88._0_4_ = auVar87._0_4_ * fVar10;
          fVar12 = local_27c0._4_4_;
          auVar88._4_4_ = auVar87._4_4_ * fVar12;
          fVar14 = local_27c0._8_4_;
          auVar88._8_4_ = auVar87._8_4_ * fVar14;
          fVar16 = local_27c0._12_4_;
          auVar88._12_4_ = auVar87._12_4_ * fVar16;
          auVar52 = vfmsub231ps_fma(auVar88,local_27d0,auVar82);
          auVar89._0_4_ = fVar2 * auVar52._0_4_;
          auVar89._4_4_ = fVar2 * auVar52._4_4_;
          auVar89._8_4_ = fVar2 * auVar52._8_4_;
          auVar89._12_4_ = fVar2 * auVar52._12_4_;
          auVar62 = vfmadd231ps_fma(auVar89,auVar114,auVar62);
          local_26e0 = vfmadd231ps_fma(auVar62,auVar129,auVar54);
          auVar62 = vsubps_avx(auVar60,auVar61);
          auVar97._0_4_ = auVar61._0_4_ + auVar60._0_4_;
          auVar97._4_4_ = auVar61._4_4_ + auVar60._4_4_;
          auVar97._8_4_ = auVar61._8_4_ + auVar60._8_4_;
          auVar97._12_4_ = auVar61._12_4_ + auVar60._12_4_;
          auVar61 = vsubps_avx(auVar72,auVar90);
          auVar54._0_4_ = auVar72._0_4_ + auVar90._0_4_;
          auVar54._4_4_ = auVar72._4_4_ + auVar90._4_4_;
          auVar54._8_4_ = auVar72._8_4_ + auVar90._8_4_;
          auVar54._12_4_ = auVar72._12_4_ + auVar90._12_4_;
          auVar90 = vsubps_avx(auVar79,auVar64);
          auVar63._0_4_ = auVar79._0_4_ + auVar64._0_4_;
          auVar63._4_4_ = auVar79._4_4_ + auVar64._4_4_;
          auVar63._8_4_ = auVar79._8_4_ + auVar64._8_4_;
          auVar63._12_4_ = auVar79._12_4_ + auVar64._12_4_;
          auVar106._0_4_ = auVar54._0_4_ * auVar90._0_4_;
          auVar106._4_4_ = auVar54._4_4_ * auVar90._4_4_;
          auVar106._8_4_ = auVar54._8_4_ * auVar90._8_4_;
          auVar106._12_4_ = auVar54._12_4_ * auVar90._12_4_;
          auVar72 = vfmsub231ps_fma(auVar106,auVar61,auVar63);
          auVar64._0_4_ = auVar63._0_4_ * auVar62._0_4_;
          auVar64._4_4_ = auVar63._4_4_ * auVar62._4_4_;
          auVar64._8_4_ = auVar63._8_4_ * auVar62._8_4_;
          auVar64._12_4_ = auVar63._12_4_ * auVar62._12_4_;
          auVar60 = vfmsub231ps_fma(auVar64,auVar90,auVar97);
          auVar98._0_4_ = auVar61._0_4_ * auVar97._0_4_;
          auVar98._4_4_ = auVar61._4_4_ * auVar97._4_4_;
          auVar98._8_4_ = auVar61._8_4_ * auVar97._8_4_;
          auVar98._12_4_ = auVar61._12_4_ * auVar97._12_4_;
          auVar79 = vfmsub231ps_fma(auVar98,auVar62,auVar54);
          auVar99._0_4_ = fVar2 * auVar79._0_4_;
          auVar99._4_4_ = fVar2 * auVar79._4_4_;
          auVar99._8_4_ = fVar2 * auVar79._8_4_;
          auVar99._12_4_ = fVar2 * auVar79._12_4_;
          auVar60 = vfmadd231ps_fma(auVar99,auVar114,auVar60);
          auVar79 = vfmadd231ps_fma(auVar60,auVar129,auVar72);
          local_26f0 = local_27f0._0_4_;
          fStack_26ec = local_27f0._4_4_;
          fStack_26e8 = local_27f0._8_4_;
          fStack_26e4 = local_27f0._12_4_;
          local_26d0._0_4_ = auVar79._0_4_ + local_26f0 + local_26e0._0_4_;
          local_26d0._4_4_ = auVar79._4_4_ + fStack_26ec + local_26e0._4_4_;
          local_26d0._8_4_ = auVar79._8_4_ + fStack_26e8 + local_26e0._8_4_;
          local_26d0._12_4_ = auVar79._12_4_ + fStack_26e4 + local_26e0._12_4_;
          auVar132._8_4_ = 0x7fffffff;
          auVar132._0_8_ = 0x7fffffff7fffffff;
          auVar132._12_4_ = 0x7fffffff;
          auVar60 = vminps_avx(local_27f0,local_26e0);
          auVar60 = vminps_avx(auVar60,auVar79);
          local_2620 = vandps_avx(local_26d0,auVar132);
          auVar115._0_4_ = local_2620._0_4_ * 1.1920929e-07;
          auVar115._4_4_ = local_2620._4_4_ * 1.1920929e-07;
          auVar115._8_4_ = local_2620._8_4_ * 1.1920929e-07;
          auVar115._12_4_ = local_2620._12_4_ * 1.1920929e-07;
          uVar44 = CONCAT44(auVar115._4_4_,auVar115._0_4_);
          auVar107._0_8_ = uVar44 ^ 0x8000000080000000;
          auVar107._8_4_ = -auVar115._8_4_;
          auVar107._12_4_ = -auVar115._12_4_;
          auVar60 = vcmpps_avx(auVar60,auVar107,5);
          auVar72 = vmaxps_avx(local_27f0,local_26e0);
          auVar72 = vmaxps_avx(auVar72,auVar79);
          auVar72 = vcmpps_avx(auVar72,auVar115,2);
          local_2870 = vorps_avx(auVar60,auVar72);
          k = local_2880;
          ray = local_2878;
          if ((((local_2870 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (local_2870 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (local_2870 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              local_2870[0xf] < '\0') {
            auVar65._0_4_ = fVar10 * local_2830._0_4_;
            auVar65._4_4_ = fVar12 * local_2830._4_4_;
            auVar65._8_4_ = fVar14 * local_2830._8_4_;
            auVar65._12_4_ = fVar16 * local_2830._12_4_;
            auVar100._0_4_ = fVar131 * local_27b0._0_4_;
            auVar100._4_4_ = fVar134 * local_27b0._4_4_;
            auVar100._8_4_ = fVar135 * local_27b0._8_4_;
            auVar100._12_4_ = fVar136 * local_27b0._12_4_;
            auVar79 = vfmsub213ps_fma(local_27b0,local_27e0,auVar65);
            auVar108._0_4_ = auVar61._0_4_ * fVar9;
            auVar108._4_4_ = auVar61._4_4_ * fVar11;
            auVar108._8_4_ = auVar61._8_4_ * fVar13;
            auVar108._12_4_ = auVar61._12_4_ * fVar15;
            auVar116._0_4_ = fVar131 * auVar90._0_4_;
            auVar116._4_4_ = fVar134 * auVar90._4_4_;
            auVar116._8_4_ = fVar135 * auVar90._8_4_;
            auVar116._12_4_ = fVar136 * auVar90._12_4_;
            auVar90 = vfmsub213ps_fma(auVar90,local_27c0,auVar108);
            auVar60 = vandps_avx(auVar132,auVar65);
            auVar72 = vandps_avx(auVar132,auVar108);
            auVar60 = vcmpps_avx(auVar60,auVar72,1);
            local_2670 = vblendvps_avx(auVar90,auVar79,auVar60);
            auVar92._0_4_ = fVar10 * auVar62._0_4_;
            auVar92._4_4_ = fVar12 * auVar62._4_4_;
            auVar92._8_4_ = fVar14 * auVar62._8_4_;
            auVar92._12_4_ = fVar16 * auVar62._12_4_;
            auVar79 = vfmsub213ps_fma(auVar62,local_27e0,auVar116);
            auVar109._0_4_ = local_2820._0_4_ * fVar9;
            auVar109._4_4_ = local_2820._4_4_ * fVar11;
            auVar109._8_4_ = local_2820._8_4_ * fVar13;
            auVar109._12_4_ = local_2820._12_4_ * fVar15;
            auVar90 = vfmsub213ps_fma(local_2830,local_27d0,auVar109);
            auVar60 = vandps_avx(auVar132,auVar109);
            auVar72 = vandps_avx(auVar116,auVar132);
            auVar60 = vcmpps_avx(auVar60,auVar72,1);
            local_2660 = vblendvps_avx(auVar79,auVar90,auVar60);
            auVar79 = vfmsub213ps_fma(local_2820,local_27c0,auVar100);
            auVar61 = vfmsub213ps_fma(auVar61,local_27d0,auVar92);
            auVar60 = vandps_avx(auVar132,auVar100);
            auVar72 = vandps_avx(auVar132,auVar92);
            auVar60 = vcmpps_avx(auVar60,auVar72,1);
            local_2650 = vblendvps_avx(auVar61,auVar79,auVar60);
            auVar93._0_4_ = local_2650._0_4_ * fVar2;
            auVar93._4_4_ = local_2650._4_4_ * fVar2;
            auVar93._8_4_ = local_2650._8_4_ * fVar2;
            auVar93._12_4_ = local_2650._12_4_ * fVar2;
            auVar60 = vfmadd213ps_fma(auVar114,local_2660,auVar93);
            auVar60 = vfmadd213ps_fma(auVar129,local_2670,auVar60);
            auVar94._0_4_ = auVar60._0_4_ + auVar60._0_4_;
            auVar94._4_4_ = auVar60._4_4_ + auVar60._4_4_;
            auVar94._8_4_ = auVar60._8_4_ + auVar60._8_4_;
            auVar94._12_4_ = auVar60._12_4_ + auVar60._12_4_;
            auVar101._0_4_ = local_2650._0_4_ * fVar3;
            auVar101._4_4_ = local_2650._4_4_ * fVar4;
            auVar101._8_4_ = local_2650._8_4_ * fVar17;
            auVar101._12_4_ = local_2650._12_4_ * fVar8;
            auVar60 = vfmadd213ps_fma(local_2790,local_2660,auVar101);
            auVar72 = vfmadd213ps_fma(local_2810,local_2670,auVar60);
            auVar60 = vrcpps_avx(auVar94);
            auVar117._8_4_ = 0x3f800000;
            auVar117._0_8_ = 0x3f8000003f800000;
            auVar117._12_4_ = 0x3f800000;
            auVar79 = vfnmadd213ps_fma(auVar60,auVar94,auVar117);
            auVar60 = vfmadd132ps_fma(auVar79,auVar60,auVar60);
            local_2680._0_4_ = auVar60._0_4_ * (auVar72._0_4_ + auVar72._0_4_);
            local_2680._4_4_ = auVar60._4_4_ * (auVar72._4_4_ + auVar72._4_4_);
            local_2680._8_4_ = auVar60._8_4_ * (auVar72._8_4_ + auVar72._8_4_);
            local_2680._12_4_ = auVar60._12_4_ * (auVar72._12_4_ + auVar72._12_4_);
            auVar103 = ZEXT1664(local_2680);
            uVar24 = *(undefined4 *)(local_2878 + local_2880 * 4 + 0x60);
            auVar102._4_4_ = uVar24;
            auVar102._0_4_ = uVar24;
            auVar102._8_4_ = uVar24;
            auVar102._12_4_ = uVar24;
            auVar60 = vcmpps_avx(auVar102,local_2680,2);
            uVar24 = *(undefined4 *)(local_2878 + local_2880 * 4 + 0x100);
            auVar118._4_4_ = uVar24;
            auVar118._0_4_ = uVar24;
            auVar118._8_4_ = uVar24;
            auVar118._12_4_ = uVar24;
            auVar110 = ZEXT1664(auVar118);
            auVar72 = vcmpps_avx(local_2680,auVar118,2);
            auVar60 = vandps_avx(auVar60,auVar72);
            auVar72 = local_2870 & auVar60;
            if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar72 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar72 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar72[0xf] < '\0') {
              auVar60 = vandps_avx(auVar60,local_2870);
              auVar72 = vcmpps_avx(auVar94,_DAT_01f7aa10,4);
              auVar79 = auVar72 & auVar60;
              if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar79 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar79[0xf] < '\0') {
                local_2800 = vandps_avx(auVar60,auVar72);
                pRVar26 = &local_2881;
                local_26c0 = pRVar26;
                local_26b0 = local_2800;
                auVar60 = vrcpps_avx(local_26d0);
                auVar75._8_4_ = 0x3f800000;
                auVar75._0_8_ = 0x3f8000003f800000;
                auVar75._12_4_ = 0x3f800000;
                auVar72 = vfnmadd213ps_fma(local_26d0,auVar60,auVar75);
                auVar72 = vfmadd132ps_fma(auVar72,auVar60,auVar60);
                auVar66._8_4_ = 0x219392ef;
                auVar66._0_8_ = 0x219392ef219392ef;
                auVar66._12_4_ = 0x219392ef;
                auVar60 = vcmpps_avx(local_2620,auVar66,5);
                auVar60 = vandps_avx(auVar72,auVar60);
                auVar55._0_4_ = local_26f0 * auVar60._0_4_;
                auVar55._4_4_ = fStack_26ec * auVar60._4_4_;
                auVar55._8_4_ = fStack_26e8 * auVar60._8_4_;
                auVar55._12_4_ = fStack_26e4 * auVar60._12_4_;
                local_26a0 = vminps_avx(auVar55,auVar75);
                auVar56._0_4_ = auVar60._0_4_ * local_26e0._0_4_;
                auVar56._4_4_ = auVar60._4_4_ * local_26e0._4_4_;
                auVar56._8_4_ = auVar60._8_4_ * local_26e0._8_4_;
                auVar56._12_4_ = auVar60._12_4_ * local_26e0._12_4_;
                local_2690 = vminps_avx(auVar56,auVar75);
                auVar67._8_4_ = 0x7f800000;
                auVar67._0_8_ = 0x7f8000007f800000;
                auVar67._12_4_ = 0x7f800000;
                auVar60 = vblendvps_avx(auVar67,local_2680,local_2800);
                auVar72 = vshufps_avx(auVar60,auVar60,0xb1);
                auVar72 = vminps_avx(auVar72,auVar60);
                auVar79 = vshufpd_avx(auVar72,auVar72,1);
                auVar72 = vminps_avx(auVar79,auVar72);
                auVar60 = vcmpps_avx(auVar60,auVar72,0);
                auVar79 = local_2800 & auVar60;
                auVar72 = vpcmpeqd_avx(auVar72,auVar72);
                if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar79 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar79[0xf] < '\0') {
                  auVar72 = auVar60;
                }
                auVar60 = vandps_avx(local_2800,auVar72);
                local_2838 = pSVar40;
                do {
                  auVar60 = vpslld_avx(auVar60,0x1f);
                  uVar24 = vmovmskps_avx(auVar60);
                  lVar27 = 0;
                  for (uVar44 = CONCAT44((int)((ulong)pRVar26 >> 0x20),uVar24); (uVar44 & 1) == 0;
                      uVar44 = uVar44 >> 1 | 0x8000000000000000) {
                    lVar27 = lVar27 + 1;
                  }
                  uVar30 = *(uint *)((long)&local_2610 + lVar27 * 4);
                  pRVar26 = (RayHitK<8> *)(ulong)uVar30;
                  pGVar46 = (pSVar40->geometries).items[(long)pRVar26].ptr;
                  if ((pGVar46->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    *(undefined4 *)(local_2800 + lVar27 * 4) = 0;
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar46->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      uVar44 = (ulong)(uint)((int)lVar27 << 2);
                      uVar24 = *(undefined4 *)(local_26a0 + uVar44);
                      uVar5 = *(undefined4 *)(local_2690 + uVar44);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2680 + uVar44);
                      *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_2670 + uVar44);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_2660 + uVar44);
                      *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_2650 + uVar44);
                      *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar24;
                      *(undefined4 *)(ray + k * 4 + 0x200) = uVar5;
                      *(undefined4 *)(ray + k * 4 + 0x220) =
                           *(undefined4 *)((long)&local_2730 + uVar44);
                      *(uint *)(ray + k * 4 + 0x240) = uVar30;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    uVar44 = (ulong)(uint)((int)lVar27 * 4);
                    uVar24 = *(undefined4 *)(local_26a0 + uVar44);
                    local_2460._4_4_ = uVar24;
                    local_2460._0_4_ = uVar24;
                    local_2460._8_4_ = uVar24;
                    local_2460._12_4_ = uVar24;
                    local_2460._16_4_ = uVar24;
                    local_2460._20_4_ = uVar24;
                    local_2460._24_4_ = uVar24;
                    local_2460._28_4_ = uVar24;
                    local_2440 = *(undefined4 *)(local_2690 + uVar44);
                    local_2420 = *(undefined4 *)((long)&local_2730 + uVar44);
                    uVar24 = *(undefined4 *)(local_2670 + uVar44);
                    local_24c0._4_4_ = uVar24;
                    local_24c0._0_4_ = uVar24;
                    local_24c0._8_4_ = uVar24;
                    local_24c0._12_4_ = uVar24;
                    local_24c0._16_4_ = uVar24;
                    local_24c0._20_4_ = uVar24;
                    local_24c0._24_4_ = uVar24;
                    local_24c0._28_4_ = uVar24;
                    uVar24 = *(undefined4 *)(local_2660 + uVar44);
                    local_24a0._4_4_ = uVar24;
                    local_24a0._0_4_ = uVar24;
                    local_24a0._8_4_ = uVar24;
                    local_24a0._12_4_ = uVar24;
                    local_24a0._16_4_ = uVar24;
                    local_24a0._20_4_ = uVar24;
                    local_24a0._24_4_ = uVar24;
                    local_24a0._28_4_ = uVar24;
                    uVar24 = *(undefined4 *)(local_2650 + uVar44);
                    local_2480._4_4_ = uVar24;
                    local_2480._0_4_ = uVar24;
                    local_2480._8_4_ = uVar24;
                    local_2480._12_4_ = uVar24;
                    local_2480._16_4_ = uVar24;
                    local_2480._20_4_ = uVar24;
                    local_2480._24_4_ = uVar24;
                    local_2480._28_4_ = uVar24;
                    auVar76._4_4_ = uVar30;
                    auVar76._0_4_ = uVar30;
                    auVar76._8_4_ = uVar30;
                    auVar76._12_4_ = uVar30;
                    auVar77._16_4_ = uVar30;
                    auVar77._0_16_ = auVar76;
                    auVar77._20_4_ = uVar30;
                    auVar77._24_4_ = uVar30;
                    auVar77._28_4_ = uVar30;
                    uStack_243c = local_2440;
                    uStack_2438 = local_2440;
                    uStack_2434 = local_2440;
                    uStack_2430 = local_2440;
                    uStack_242c = local_2440;
                    uStack_2428 = local_2440;
                    uStack_2424 = local_2440;
                    uStack_241c = local_2420;
                    uStack_2418 = local_2420;
                    uStack_2414 = local_2420;
                    uStack_2410 = local_2420;
                    uStack_240c = local_2420;
                    uStack_2408 = local_2420;
                    uStack_2404 = local_2420;
                    local_2400 = auVar77;
                    vpcmpeqd_avx2(local_2460,local_2460);
                    uStack_23dc = context->user->instID[0];
                    local_23e0 = uStack_23dc;
                    uStack_23d8 = uStack_23dc;
                    uStack_23d4 = uStack_23dc;
                    uStack_23d0 = uStack_23dc;
                    uStack_23cc = uStack_23dc;
                    uStack_23c8 = uStack_23dc;
                    uStack_23c4 = uStack_23dc;
                    uStack_23bc = context->user->instPrimID[0];
                    local_23c0 = uStack_23bc;
                    uStack_23b8 = uStack_23bc;
                    uStack_23b4 = uStack_23bc;
                    uStack_23b0 = uStack_23bc;
                    uStack_23ac = uStack_23bc;
                    uStack_23a8 = uStack_23bc;
                    uStack_23a4 = uStack_23bc;
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2680 + uVar44);
                    local_2640 = local_2600;
                    local_2760 = local_2640;
                    local_2758 = pGVar46->userPtr;
                    local_2750 = context->user;
                    local_2740 = &local_24c0;
                    local_2738 = 8;
                    pRVar26 = (RayHitK<8> *)pGVar46->intersectionFilterN;
                    local_2748 = ray;
                    if (pRVar26 != (RayHitK<8> *)0x0) {
                      local_2850 = auVar103._0_16_;
                      local_2860 = auVar110._0_16_;
                      local_2870._0_8_ = lVar27;
                      local_2810._0_8_ = pGVar46;
                      auVar77 = ZEXT1632(auVar76);
                      pRVar26 = (RayHitK<8> *)(*(code *)pRVar26)(&local_2760);
                      auVar110 = ZEXT1664(local_2860);
                      auVar103 = ZEXT1664(local_2850);
                      k = local_2880;
                      pSVar40 = local_2838;
                      lVar27 = local_2870._0_8_;
                      ray = local_2878;
                      pGVar46 = (Geometry *)local_2810._0_8_;
                    }
                    auVar58 = vpcmpeqd_avx2(local_2640,_DAT_01faff00);
                    auVar78 = vpcmpeqd_avx2(auVar77,auVar77);
                    auVar69 = auVar78 & ~auVar58;
                    if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar69 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar69 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar69 >> 0x7f,0) == '\0') &&
                          (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar69 >> 0xbf,0) == '\0') &&
                        (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar69[0x1f]) {
                      auVar58 = auVar58 ^ auVar78;
                    }
                    else {
                      pRVar26 = (RayHitK<8> *)context->args->filter;
                      if ((pRVar26 != (RayHitK<8> *)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar46->field_8).field_0x2 & 0x40) != 0)))) {
                        local_2850 = auVar103._0_16_;
                        local_2860 = auVar110._0_16_;
                        local_2870._0_8_ = lVar27;
                        auVar78 = ZEXT1632(auVar78._0_16_);
                        pRVar26 = (RayHitK<8> *)(*(code *)pRVar26)(&local_2760);
                        auVar110 = ZEXT1664(local_2860);
                        auVar103 = ZEXT1664(local_2850);
                        k = local_2880;
                        pSVar40 = local_2838;
                        lVar27 = local_2870._0_8_;
                        ray = local_2878;
                      }
                      auVar19 = vpcmpeqd_avx2(local_2640,_DAT_01faff00);
                      auVar78 = vpcmpeqd_avx2(auVar78,auVar78);
                      auVar58 = auVar19 ^ auVar78;
                      auVar69 = auVar78 & ~auVar19;
                      if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar69 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar69 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar69 >> 0x7f,0) != '\0') ||
                            (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar69 >> 0xbf,0) != '\0') ||
                          (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar69[0x1f] < '\0') {
                        auVar71._0_4_ = auVar19._0_4_ ^ auVar78._0_4_;
                        auVar71._4_4_ = auVar19._4_4_ ^ auVar78._4_4_;
                        auVar71._8_4_ = auVar19._8_4_ ^ auVar78._8_4_;
                        auVar71._12_4_ = auVar19._12_4_ ^ auVar78._12_4_;
                        auVar71._16_4_ = auVar19._16_4_ ^ auVar78._16_4_;
                        auVar71._20_4_ = auVar19._20_4_ ^ auVar78._20_4_;
                        auVar71._24_4_ = auVar19._24_4_ ^ auVar78._24_4_;
                        auVar71._28_4_ = auVar19._28_4_ ^ auVar78._28_4_;
                        auVar69 = vmaskmovps_avx(auVar71,*local_2740);
                        *(undefined1 (*) [32])(local_2748 + 0x180) = auVar69;
                        auVar69 = vmaskmovps_avx(auVar71,local_2740[1]);
                        *(undefined1 (*) [32])(local_2748 + 0x1a0) = auVar69;
                        auVar69 = vmaskmovps_avx(auVar71,local_2740[2]);
                        *(undefined1 (*) [32])(local_2748 + 0x1c0) = auVar69;
                        auVar69 = vmaskmovps_avx(auVar71,local_2740[3]);
                        *(undefined1 (*) [32])(local_2748 + 0x1e0) = auVar69;
                        auVar69 = vmaskmovps_avx(auVar71,local_2740[4]);
                        *(undefined1 (*) [32])(local_2748 + 0x200) = auVar69;
                        auVar69 = vpmaskmovd_avx2(auVar71,local_2740[5]);
                        *(undefined1 (*) [32])(local_2748 + 0x220) = auVar69;
                        auVar69 = vpmaskmovd_avx2(auVar71,local_2740[6]);
                        *(undefined1 (*) [32])(local_2748 + 0x240) = auVar69;
                        auVar69 = vpmaskmovd_avx2(auVar71,local_2740[7]);
                        *(undefined1 (*) [32])(local_2748 + 0x260) = auVar69;
                        auVar69 = vpmaskmovd_avx2(auVar71,local_2740[8]);
                        *(undefined1 (*) [32])(local_2748 + 0x280) = auVar69;
                        pRVar26 = local_2748;
                      }
                    }
                    if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar58 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar58 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar58 >> 0x7f,0) == '\0') &&
                          (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar58 >> 0xbf,0) == '\0') &&
                        (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar58[0x1f]) {
                      *(int *)(ray + k * 4 + 0x100) = auVar110._0_4_;
                    }
                    else {
                      auVar110 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                    }
                    *(undefined4 *)(local_2800 + lVar27 * 4) = 0;
                    uVar24 = auVar110._0_4_;
                    auVar57._4_4_ = uVar24;
                    auVar57._0_4_ = uVar24;
                    auVar57._8_4_ = uVar24;
                    auVar57._12_4_ = uVar24;
                    auVar60 = vcmpps_avx(auVar103._0_16_,auVar57,2);
                    local_2800 = vandps_avx(auVar60,local_2800);
                  }
                  if ((((local_2800 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_2800 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_2800 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_2800[0xf]) break;
                  auVar68._8_4_ = 0x7f800000;
                  auVar68._0_8_ = 0x7f8000007f800000;
                  auVar68._12_4_ = 0x7f800000;
                  auVar60 = vblendvps_avx(auVar68,auVar103._0_16_,local_2800);
                  auVar72 = vshufps_avx(auVar60,auVar60,0xb1);
                  auVar72 = vminps_avx(auVar72,auVar60);
                  auVar79 = vshufpd_avx(auVar72,auVar72,1);
                  auVar72 = vminps_avx(auVar79,auVar72);
                  auVar72 = vcmpps_avx(auVar60,auVar72,0);
                  auVar79 = local_2800 & auVar72;
                  auVar60 = local_2800;
                  if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar79 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar79[0xf] < '\0') {
                    auVar60 = vandps_avx(auVar72,local_2800);
                  }
                  auVar60 = vpcmpgtd_avx(ZEXT816(0) << 0x20,auVar60);
                } while( true );
              }
            }
          }
          local_2778 = local_2778 + 1;
        } while (local_2778 != local_2780);
      }
      uVar24 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar59 = ZEXT3264(CONCAT428(uVar24,CONCAT424(uVar24,CONCAT420(uVar24,CONCAT416(uVar24,
                                                  CONCAT412(uVar24,CONCAT48(uVar24,CONCAT44(uVar24,
                                                  uVar24))))))));
      auVar103 = ZEXT3264(local_24e0);
      auVar110 = ZEXT3264(local_2500);
      auVar112 = ZEXT3264(local_2520);
      auVar119 = ZEXT3264(local_2540);
      auVar121 = ZEXT3264(local_2560);
      auVar122 = ZEXT3264(local_2580);
      auVar124 = ZEXT3264(local_25a0);
      auVar127 = ZEXT3264(local_25c0);
      auVar130 = ZEXT3264(local_25e0);
      auVar133 = ZEXT3264(local_2720);
    }
    if (pauVar25 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }